

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error ft_glyphslot_alloc_bitmap(FT_GlyphSlot slot,FT_ULong size)

{
  uint uVar1;
  FT_Memory memory;
  undefined8 in_RAX;
  uchar *puVar2;
  FT_Error error;
  FT_Error local_24;
  
  local_24 = (FT_Error)((ulong)in_RAX >> 0x20);
  memory = slot->face->memory;
  uVar1 = slot->internal->flags;
  if ((uVar1 & 1) == 0) {
    slot->internal->flags = uVar1 | 1;
  }
  else {
    puVar2 = (slot->bitmap).buffer;
    if (puVar2 != (uchar *)0x0) {
      (*memory->free)(memory,puVar2);
    }
    (slot->bitmap).buffer = (uchar *)0x0;
  }
  puVar2 = (uchar *)ft_mem_alloc(memory,size,&local_24);
  (slot->bitmap).buffer = puVar2;
  return local_24;
}

Assistant:

FT_BASE_DEF( FT_Error )
  ft_glyphslot_alloc_bitmap( FT_GlyphSlot  slot,
                             FT_ULong      size )
  {
    FT_Memory  memory = FT_FACE_MEMORY( slot->face );
    FT_Error   error;


    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
      FT_FREE( slot->bitmap.buffer );
    else
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    (void)FT_ALLOC( slot->bitmap.buffer, size );
    return error;
  }